

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall Fl_Browser::lineposition(Fl_Browser *this,int line,Fl_Line_Position pos)

{
  FL_BLINE *pFVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FL_BLINE **ppFVar5;
  int H;
  int W;
  int Y;
  int X;
  
  iVar4 = 1;
  if (1 < line) {
    iVar4 = line;
  }
  if (this->lines <= iVar4) {
    iVar4 = this->lines;
  }
  ppFVar5 = &this->first;
  iVar3 = 0;
  for (; (pFVar1 = *ppFVar5, pFVar1 != (FL_BLINE *)0x0 && (1 < iVar4)); iVar4 = iVar4 + -1) {
    iVar2 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,pFVar1);
    iVar3 = iVar3 + iVar2;
    ppFVar5 = &pFVar1->next;
  }
  if (pos == BOTTOM && pFVar1 != (FL_BLINE *)0x0) {
    iVar4 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                      (this,pFVar1);
    iVar3 = iVar3 + iVar4;
    Fl_Browser_::bbox(&this->super_Fl_Browser_,&X,&Y,&W,&H);
  }
  else {
    Fl_Browser_::bbox(&this->super_Fl_Browser_,&X,&Y,&W,&H);
    if (pos == MIDDLE) {
      iVar3 = iVar3 + H / -2;
      goto LAB_001a6270;
    }
    if (pos != BOTTOM) goto LAB_001a6270;
  }
  iVar3 = iVar3 - H;
LAB_001a6270:
  iVar4 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
  if (iVar4 - H < iVar3) {
    iVar3 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
    iVar3 = iVar3 - H;
  }
  Fl_Browser_::position(&this->super_Fl_Browser_,iVar3);
  return;
}

Assistant:

void Fl_Browser::lineposition(int line, Fl_Line_Position pos) {
  if (line<1) line = 1;
  if (line>lines) line = lines;
  int p = 0;

  FL_BLINE* l;
  for (l=first; l && line>1; l = l->next) {
    line--; p += item_height(l);
  }
  if (l && (pos == BOTTOM)) p += item_height (l);

  int final = p, X, Y, W, H;
  bbox(X, Y, W, H);

  switch(pos) {
    case TOP: break;
    case BOTTOM: final -= H; break;
    case MIDDLE: final -= H/2; break;
  }
  
  if (final > (full_height() - H)) final = full_height() -H;
  position(final);
}